

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void NULLCFile::FileClose(File *file)

{
  if (file != (File *)0x0) {
    if ((file->flag & 1) != 0) {
      fclose((FILE *)file->handle);
    }
    file->flag = 0;
    file->handle = (FILE *)0x0;
    return;
  }
  nullcThrowError("ERROR: null pointer access");
  return;
}

Assistant:

void FileClose(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(file->flag & FILE_OPENED)
			fclose(file->handle);

		file->flag = 0;
		file->handle = NULL;
	}